

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

translation_t * opengv::absolute_pose::p2p(AbsoluteAdapterBase *adapter,size_t index0,size_t index1)

{
  double dVar1;
  Scalar SVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  translation_t *in_RDI;
  __type _Var5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double temp3;
  double b;
  double cos_beta;
  Vector3d temp2;
  double d_12;
  Vector3d temp1;
  Matrix3d Q;
  rotation_t N;
  Vector3d n2;
  Vector3d n3;
  Vector3d n1;
  rotation_t T;
  Vector3d e2;
  Vector3d e3;
  Vector3d e1;
  translation_t *solution;
  undefined4 in_stack_fffffffffffff988;
  int in_stack_fffffffffffff98c;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffff990;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffff998;
  Scalar SVar26;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
  *in_stack_fffffffffffff9a0;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9b0;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9b8;
  StorageBaseType *in_stack_fffffffffffff9d0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9d8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffa20;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffa28;
  undefined1 local_5b8 [152];
  double local_520;
  double local_4c8;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_4c0;
  double local_4b8;
  undefined1 local_4b0 [24];
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *local_498;
  undefined1 local_490 [24];
  undefined1 local_478 [72];
  non_const_type local_430;
  non_const_type local_3e0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_3d8;
  non_const_type local_338;
  non_const_type local_300;
  non_const_type local_2c8;
  RealScalar local_260;
  RealScalar local_220;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [120];
  non_const_type local_168;
  non_const_type local_130;
  non_const_type local_f8;
  RealScalar local_90;
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_38,in_RSI,in_RDX);
  (**(code **)(*local_10 + 0x10))(local_50,local_10,local_20);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_90 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffff9d8,(double *)in_stack_fffffffffffff9d0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x712aaa);
  local_f8 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_130 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_168 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  (**(code **)(*local_10 + 0x30))(local_1e0,local_10,local_20);
  (**(code **)(*local_10 + 0x30))(local_1f8,local_10,local_18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_220 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffff9d8,(double *)in_stack_fffffffffffff9d0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x712c38);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pSVar3;
  auVar11._8_8_ = 0x7fffffffffffffff;
  auVar11._0_8_ = 0x7fffffffffffffff;
  auVar7 = vpand_avx(auVar7,auVar11);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar3;
  auVar20._8_8_ = 0x7fffffffffffffff;
  auVar20._0_8_ = 0x7fffffffffffffff;
  auVar11 = vpand_avx(auVar12,auVar20);
  if (auVar11._0_8_ < auVar7._0_8_) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffff990,
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *pSVar3;
    auVar13._8_8_ = 0x7fffffffffffffff;
    auVar13._0_8_ = 0x7fffffffffffffff;
    auVar7 = vpand_avx(auVar8,auVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffff990,
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *pSVar3;
    auVar21._8_8_ = 0x7fffffffffffffff;
    auVar21._0_8_ = 0x7fffffffffffffff;
    auVar11 = vpand_avx(auVar14,auVar21);
    if (auVar11._0_8_ < auVar7._0_8_) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      *pSVar3 = 1.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      *pSVar3 = 0.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      dVar6 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      *pSVar3 = -dVar6 / dVar1;
      goto LAB_00712fad;
    }
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar3;
  auVar15._8_8_ = 0x7fffffffffffffff;
  auVar15._0_8_ = 0x7fffffffffffffff;
  auVar7 = vpand_avx(auVar9,auVar15);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pSVar3;
  auVar22._8_8_ = 0x7fffffffffffffff;
  auVar22._0_8_ = 0x7fffffffffffffff;
  auVar11 = vpand_avx(auVar16,auVar22);
  if (auVar11._0_8_ < auVar7._0_8_) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffff990,
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *pSVar3;
    auVar17._8_8_ = 0x7fffffffffffffff;
    auVar17._0_8_ = 0x7fffffffffffffff;
    auVar7 = vpand_avx(auVar10,auVar17);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffff990,
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *pSVar3;
    auVar23._8_8_ = 0x7fffffffffffffff;
    auVar23._0_8_ = 0x7fffffffffffffff;
    auVar11 = vpand_avx(auVar18,auVar23);
    if (auVar11._0_8_ < auVar7._0_8_) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      *pSVar3 = 1.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      *pSVar3 = 0.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      in_stack_fffffffffffff9d0 = (StorageBaseType *)((ulong)*pSVar3 ^ 0x8000000000000000);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      in_stack_fffffffffffff9d8 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           ((double)in_stack_fffffffffffff9d0 / *pSVar3);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      *pSVar3 = (Scalar)in_stack_fffffffffffff9d8;
      goto LAB_00712fad;
    }
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  *pSVar3 = 1.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  dVar6 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  *pSVar3 = -dVar6 / dVar1;
LAB_00712fad:
  local_260 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffff9d8,(double *)in_stack_fffffffffffff9d0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x71301f);
  local_2c8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_300 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_338 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff9a0,
             (Index)in_stack_fffffffffffff998);
  Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  AbsoluteAdapterBase::getR
            ((AbsoluteAdapterBase *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_3e0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_3d8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffff990,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_430 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
  ::operator*(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff990,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  (**(code **)(*local_10 + 0x30))(local_478,local_10,local_20);
  (**(code **)(*local_10 + 0x30))(local_490,local_10,local_18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  local_498 = (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  (**(code **)(*local_10 + 0x10))(local_4b0,local_10,local_20);
  local_4b8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff990,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  _Var5 = std::pow<double,int>((double)in_stack_fffffffffffff990,in_stack_fffffffffffff98c);
  local_4c0 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(1.0 / (1.0 - _Var5) - 1.0);
  if (0.0 <= local_4b8) {
    local_4c0 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)sqrt((double)local_4c0);
  }
  else {
    dVar6 = sqrt((double)local_4c0);
    local_4c0 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                ((ulong)dVar6 ^ 0x8000000000000000);
  }
  other = local_498;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x7132ff);
  SVar2 = *pSVar4;
  this = local_4c0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x71332c);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = -*pSVar4;
  auVar7 = vfmadd213sd_fma(auVar19,auVar24,auVar25);
  local_4c8 = (double)other * auVar7._0_8_;
  local_520 = -local_4c8;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            (this,(Index)in_stack_fffffffffffff998);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_fffffffffffff990);
  Eigen::operator*((double *)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  (**(code **)(*local_10 + 0x30))(local_5b8,local_10,local_18);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffff990,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+(in_stack_fffffffffffff9b8,other);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x713492);
  SVar26 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (in_stack_fffffffffffff990,
                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x7134b0);
  if ((SVar26 == *pSVar3) && (!NAN(SVar26) && !NAN(*pSVar3))) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       (in_stack_fffffffffffff990,
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x7134dc);
    SVar26 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       (in_stack_fffffffffffff990,
                        CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x7134fc);
    if ((SVar26 == *pSVar3) && (!NAN(SVar26) && !NAN(*pSVar3))) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x713520);
      in_stack_fffffffffffff990 =
           (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)*pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         (in_stack_fffffffffffff990,
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),0x713540);
      if (((double)in_stack_fffffffffffff990 == *pSVar3) &&
         (!NAN((double)in_stack_fffffffffffff990) && !NAN(*pSVar3))) {
        return in_RDI;
      }
    }
  }
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff990,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
  return in_RDI;
}

Assistant:

opengv::translation_t
opengv::absolute_pose::p2p(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d e1 = adapter.getBearingVector(index0);
  Eigen::Vector3d e3 = adapter.getBearingVector(index1);
  e3 = e1.cross(e3);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  Eigen::Vector3d n1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  n1 = n1/n1.norm();
  Eigen::Vector3d n3;
  if( (fabs(n1[0]) > fabs(n1[1])) && (fabs(n1[0]) > fabs(n1[2])) )
  {
    n3[1] = 1.0;
    n3[2] = 0.0;
    n3[0] = -n1[1]/n1[0];
  }
  else
  {
    if( (fabs(n1[1]) > fabs(n1[0])) && (fabs(n1[1]) > fabs(n1[2])) )
    {
      n3[2] = 1.0;
      n3[0] = 0.0;
      n3[1] = -n1[2]/n1[1];
    }
    else
    {
      n3[0] = 1.0;
      n3[1] = 0.0;
      n3[2] = -n1[0]/n1[2];
    }
  }
  n3 = n3 / n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  Eigen::Matrix3d Q = T * adapter.getR().transpose() * N.transpose();
  Eigen::Vector3d temp1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  double d_12 = temp1.norm();

  Eigen::Vector3d temp2 = adapter.getBearingVector(index1);
  double cos_beta = e1.dot(temp2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double temp3 = d_12 * ( Q(1,0) * b - Q(0,0) );

  translation_t solution = -temp3 * Q.row(0).transpose();
  solution = adapter.getPoint(index0) + N.transpose()*solution;

  if(
    solution(0,0) != solution(0,0) ||
    solution(1,0) != solution(1,0) ||
    solution(2,0) != solution(2,0) )
    solution = Eigen::Vector3d::Zero();

  return solution;
}